

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_impl.c
# Opt level: O0

int log_impl_destroy(log_impl impl)

{
  void *in_RDI;
  size_t iterator;
  int result;
  ulong local_20;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int local_4;
  
  if (in_RDI == (void *)0x0) {
    local_4 = 0;
  }
  else {
    for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
      if (*(long *)((long)in_RDI + local_20 * 8 + 0x10) != 0) {
        log_aspect_destroy((log_aspect)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)
                          );
      }
    }
    local_4 = log_handle_destroy((log_handle)0x1069b8);
    free(in_RDI);
  }
  return local_4;
}

Assistant:

int log_impl_destroy(log_impl impl)
{
	if (impl != NULL)
	{
		int result;

		size_t iterator;

		for (iterator = 0; iterator < LOG_ASPECT_SIZE; ++iterator)
		{
			if (impl->aspects[iterator] != NULL)
			{
				log_aspect_destroy(impl->aspects[iterator]);
			}
		}

		result = log_handle_destroy(impl->handle);

		free(impl);

		return result;
	}

	return 0;
}